

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subflow.cc
# Opt level: O3

bool __thiscall SubfloatFlow::createLink(SubfloatFlow *this,ReplaceOp *rop,int4 slot,Varnode *vn)

{
  pointer *pppRVar1;
  ReplaceVarnode *pRVar2;
  pointer ppRVar3;
  ulong uVar4;
  iterator iVar5;
  bool inworklist;
  ReplaceVarnode *rep;
  bool local_41;
  ReplaceVarnode *local_40;
  ReplaceVarnode *local_38;
  
  pRVar2 = setReplacement(this,vn,&local_41);
  if (pRVar2 != (ReplaceVarnode *)0x0) {
    local_40 = pRVar2;
    if (rop != (ReplaceOp *)0x0) {
      if (slot == -1) {
        rop->output = pRVar2;
        pRVar2->def = rop;
      }
      else {
        uVar4 = (ulong)slot;
        ppRVar3 = (rop->input).
                  super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar5._M_current =
             (rop->input).
             super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)iVar5._M_current - (long)ppRVar3 >> 3) <= uVar4) {
          do {
            local_38 = (ReplaceVarnode *)0x0;
            if (iVar5._M_current ==
                (rop->input).
                super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>>::
              _M_realloc_insert<SubfloatFlow::ReplaceVarnode*>
                        ((vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>>
                          *)&rop->input,iVar5,&local_38);
              iVar5._M_current =
                   (rop->input).
                   super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *iVar5._M_current = (ReplaceVarnode *)0x0;
              iVar5._M_current =
                   (rop->input).
                   super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              (rop->input).
              super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
            }
            ppRVar3 = (rop->input).
                      super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while ((ulong)((long)iVar5._M_current - (long)ppRVar3 >> 3) <= uVar4);
        }
        ppRVar3[uVar4] = local_40;
      }
    }
    if (local_41 == true) {
      iVar5._M_current =
           (this->worklist).
           super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->worklist).
          super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>>::
        _M_realloc_insert<SubfloatFlow::ReplaceVarnode*const&>
                  ((vector<SubfloatFlow::ReplaceVarnode*,std::allocator<SubfloatFlow::ReplaceVarnode*>>
                    *)&this->worklist,iVar5,&local_40);
      }
      else {
        *iVar5._M_current = local_40;
        pppRVar1 = &(this->worklist).
                    super__Vector_base<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppRVar1 = *pppRVar1 + 1;
      }
    }
  }
  return pRVar2 != (ReplaceVarnode *)0x0;
}

Assistant:

bool SubfloatFlow::createLink(ReplaceOp *rop,int4 slot,Varnode *vn)

{ // Add a new varnode (and the edge which traced to it) to the worklist
  bool inworklist;
  ReplaceVarnode *rep = setReplacement(vn,inworklist);
  if (rep == (ReplaceVarnode *)0) return false;

  if (rop != (ReplaceOp *)0) {
    if (slot == -1) {
      rop->output = rep;
      rep->def = rop;
    }
    else {
      while(rop->input.size() <= slot)
	rop->input.push_back((ReplaceVarnode *)0);
      rop->input[slot] = rep;
    }
  }

  if (inworklist)
    worklist.push_back(rep);
  return true;
}